

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

int Psr_ManReadList(Psr_Man_t *p,Vec_Int_t *vOrder,int Type)

{
  int iVar1;
  int iToken;
  int Type_local;
  Vec_Int_t *vOrder_local;
  Psr_Man_t *p_local;
  
  Vec_IntClear(&p->vTemp);
  while( true ) {
    iVar1 = Psr_ManReadName(p);
    if (iVar1 == 0) break;
    Vec_IntPush(&p->vTemp,iVar1);
    iVar1 = Abc_Var2Lit2(iVar1,Type);
    Vec_IntPush(vOrder,iVar1);
  }
  iVar1 = Vec_IntSize(&p->vTemp);
  if (iVar1 == 0) {
    p_local._4_4_ = Psr_ManErrorSet(p,"Signal list is empty.",1);
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadList( Psr_Man_t * p, Vec_Int_t * vOrder, int Type )
{
    int iToken;
    Vec_IntClear( &p->vTemp );
    while ( (iToken = Psr_ManReadName(p)) )
    {
        Vec_IntPush( &p->vTemp, iToken );
        Vec_IntPush( vOrder, Abc_Var2Lit2(iToken, Type) );
    }
    if ( Vec_IntSize(&p->vTemp) == 0 )                return Psr_ManErrorSet(p, "Signal list is empty.", 1);
    return 0;
}